

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerResults::GenOperandBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  allocator local_49;
  string local_48;
  string dataStr;
  
  GetNumberString_abi_cxx11_(&dataStr,this,*(U64 *)(frame + 0x10),8);
  if (this->mTabular == false) {
    std::__cxx11::string::string((string *)&local_48,"D",&local_49);
    AddResult(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_48,"Data",&local_49);
    AddResult(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::operator+(&local_48,"Data ",&dataStr);
  AddResult(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&dataStr);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenOperandBubble( const Frame& frame )
{
    std::string dataStr = GetNumberString( frame.mData1, 8 );

    if( !mTabular )
    {
        AddResult( "D" );
        AddResult( "Data" );
    }
    AddResult( "Data " + dataStr );
}